

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_finally.cpp
# Opt level: O1

void __thiscall tst_qpromise_finally::fulfilledSync(tst_qpromise_finally *this)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> *pQVar3;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar4;
  PromiseResolver<int> PVar5;
  _func_int **pp_Var6;
  bool bVar7;
  char cVar8;
  int iVar9;
  PromiseDataBase<int,_void_(const_int_&)> *this_00;
  PromiseData<int> *pPVar10;
  char *pcVar11;
  char *pcVar12;
  QPromiseReject<int> *in_R8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_128;
  int value;
  QPromise<int> p;
  QPromise<int> local_108;
  PromiseResolver<int> resolver_1;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_f0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_d0 [2];
  QSharedData *local_c0;
  PromiseResolver<int> resolver;
  QPromiseBase<int> local_90;
  _func_int **local_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  undefined4 local_34;
  
  value = -1;
  local_34 = 0x2a;
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:263:24),_0>
            (&local_90,(anon_class_8_1_a8c68091)&local_34);
  QVar4.d = local_90.m_d.d;
  local_90._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012cb60;
  if (local_90.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_90.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_80 = (_func_int **)&PTR__QPromiseBase_0012cb60;
  this_00 = (PromiseDataBase<int,_void_(const_int_&)> *)operator_new(0x68);
  this_00->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  *(undefined8 *)&this_00[1].super_QSharedData = 0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0012cc00;
  QReadWriteLock::QReadWriteLock(&this_00->m_lock,0);
  local_c0 = &this_00->super_QSharedData;
  this_00->m_settled = false;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_0012cb98;
  this_00[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00[1].super_QSharedData = 0;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  local_f0.super__Function_base._M_functor._M_unused._M_object = local_80;
  local_f0.super__Function_base._M_functor._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_f0);
  local_f0.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0012ca28;
  if ((PromiseDataBase<int,_void_(const_int_&)> *)local_f0.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<int,_void_(const_int_&)> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_f0.super__Function_base._M_functor._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<int,_void_(const_int_&)> *)local_f0.super__Function_base._M_functor._8_8_
        != (PromiseDataBase<int,_void_(const_int_&)> *)0x0)) {
      (**(code **)(*(long *)local_f0.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  PVar5.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  local_58._M_unused._0_8_)->d = (Data *)PVar5.m_d.d;
  if (PVar5.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  ((long)local_58._M_unused._0_8_ + 8))->d = (Data *)PVar5.m_d.d;
  if (PVar5.m_d.d == (Data *)0x0) {
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_58._M_unused._0_8_ + 0x10))->d = (Data *)&value;
    pcStack_40 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + 1;
    UNLOCK();
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_58._M_unused._0_8_ + 0x10))->d = (Data *)&value;
    pcStack_40 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar5.m_d.d == 0) {
      operator_delete((void *)PVar5.m_d.d,0x10);
    }
  }
  if (PVar5.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar5.m_d.d == 0) {
      operator_delete((void *)PVar5.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (PVar5.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + 1;
    UNLOCK();
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  local_78._M_unused._0_8_)->d = (Data *)PVar5.m_d.d;
  if (PVar5.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  ((long)local_78._M_unused._0_8_ + 8))->d = (Data *)PVar5.m_d.d;
  if (PVar5.m_d.d == (Data *)0x0) {
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_78._M_unused._0_8_ + 0x10))->d = (Data *)&value;
    pcStack_60 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + 1;
    UNLOCK();
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_78._M_unused._0_8_ + 0x10))->d = (Data *)&value;
    pcStack_60 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar5.m_d.d == 0) {
      operator_delete((void *)PVar5.m_d.d,0x10);
    }
  }
  if (PVar5.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar5.m_d.d == 0) {
      operator_delete((void *)PVar5.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (PVar5.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar5.m_d.d == 0) {
      operator_delete((void *)PVar5.m_d.d,0x10);
    }
  }
  if (PVar5.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar5.m_d.d == 0) {
      operator_delete((void *)PVar5.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar7 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar7) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  pQVar1 = &((QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  LOCK();
  pQVar2 = &((QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012ca28;
  pPVar10 = (PromiseData<int> *)operator_new(0x68);
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar10->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar10->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0012cc00;
  QReadWriteLock::QReadWriteLock
            (&(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  pp_Var6 = local_80;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_0012cb98;
  (pPVar10->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar10->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar2 = &(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar10 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &(pPVar10->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_108.super_QPromiseBase<int>._vptr_QPromiseBase = local_80;
  p.super_QPromiseBase<int>.m_d.d = pPVar10;
  local_108.super_QPromiseBase<int>.m_d.d = pPVar10;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,&local_108);
  local_108.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012ca28;
  if (local_108.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &((local_108.super_QPromiseBase<int>.m_d.d)->
              super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_108.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_108.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_128 = resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_d0[0] = resolver_1.m_d.d;
  local_f0.super__Function_base._M_functor._M_unused._M_object = (void *)resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_f0.super__Function_base._M_functor._8_8_ = resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_f0._M_invoker = (_Invoker_type)QVar4.d;
  LOCK();
  pQVar2 = &((QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_f0.super__Function_base._M_manager = (_Manager_type)pp_Var6;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       operator_new(0x20);
  *(void **)resolver.m_d.d = local_f0.super__Function_base._M_functor._M_unused._M_object;
  if ((Data *)local_f0.super__Function_base._M_functor._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_f0.super__Function_base._M_functor._M_unused._0_8_ =
         *local_f0.super__Function_base._M_functor._M_unused._M_object + 1;
    UNLOCK();
  }
  ((Data *)resolver.m_d.d)->promise =
       (QPromise<int> *)local_f0.super__Function_base._M_functor._8_8_;
  if ((Data *)local_f0.super__Function_base._M_functor._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_f0.super__Function_base._M_functor._8_8_ =
         *(int *)local_f0.super__Function_base._M_functor._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_0012ca28;
  ((Data *)((long)resolver.m_d.d + 0x10))->promise = (QPromise<int> *)local_f0._M_invoker;
  if ((PromiseData<int> *)local_f0._M_invoker != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar3 = (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> *)
             &((PromiseDataBase<int,_void_(const_int_&)> *)local_f0._M_invoker)->super_QSharedData;
    *(int *)&pQVar3->d = *(int *)&pQVar3->d + 1;
    UNLOCK();
  }
  *(_func_int ***)((long)resolver.m_d.d + 0x10) = pp_Var6;
  local_f0.super__Function_base._M_manager = (_Manager_type)&PTR__QPromiseBase_0012ca28;
  if ((PromiseData<int> *)local_f0._M_invoker != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar3 = (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> *)
             &((PromiseDataBase<int,_void_(const_int_&)> *)local_f0._M_invoker)->super_QSharedData;
    *(int *)&pQVar3->d = *(int *)&pQVar3->d + -1;
    UNLOCK();
    if ((*(int *)&pQVar3->d == 0) &&
       ((PromiseData<int> *)local_f0._M_invoker != (PromiseData<int> *)0x0)) {
      (*((PromiseDataBase<int,_void_(const_int_&)> *)local_f0._M_invoker)->_vptr_PromiseDataBase[1])
                ();
    }
  }
  if ((Data *)local_f0.super__Function_base._M_functor._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_f0.super__Function_base._M_functor._8_8_ =
         *(int *)local_f0.super__Function_base._M_functor._8_8_ + -1;
    UNLOCK();
    if ((*(int *)local_f0.super__Function_base._M_functor._8_8_ == 0) &&
       ((Data *)local_f0.super__Function_base._M_functor._8_8_ != (Data *)0x0)) {
      operator_delete((void *)local_f0.super__Function_base._M_functor._8_8_,0x10);
    }
  }
  if ((Data *)local_f0.super__Function_base._M_functor._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_f0.super__Function_base._M_functor._M_unused._0_8_ =
         *local_f0.super__Function_base._M_functor._M_unused._M_object + -1;
    UNLOCK();
    if ((*local_f0.super__Function_base._M_functor._M_unused._M_object == 0) &&
       ((Data *)local_f0.super__Function_base._M_functor._M_unused._0_8_ != (Data *)0x0)) {
      operator_delete(local_f0.super__Function_base._M_functor._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (this_00,(function<void_(const_int_&)> *)&resolver);
  std::
  _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
  ::_M_manager((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            (&local_f0,(PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_128,
             (QPromiseResolve<int> *)local_d0,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher(this_00,&local_f0);
  if ((undefined **)local_f0.super__Function_base._M_manager != (undefined **)0x0) {
    (*local_f0.super__Function_base._M_manager)
              ((_Any_data *)&local_f0,(_Any_data *)&local_f0,__destroy_functor);
  }
  if (local_d0[0].d != (Data *)0x0) {
    LOCK();
    ((local_d0[0].d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_d0[0].d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type)
         ((local_d0[0].d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
       (local_d0[0].d != (Data *)0x0)) {
      operator_delete(local_d0[0].d,0x10);
    }
  }
  if (local_128.d != (Data *)0x0) {
    LOCK();
    ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_128.d != (Data *)0x0)) {
      operator_delete(local_128.d,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_1.m_d.d == 0) && (resolver_1.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = pp_Var6;
  bVar7 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending(this_00);
  if (!bVar7) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch(this_00);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(QVar4.d)
    ;
  }
  LOCK();
  (local_c0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_c0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_c0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(QVar4.d)
    ;
  }
  local_90._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012ca28;
  if (local_90.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_90.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_90.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_90.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])
                ();
    }
  }
  local_108.super_QPromiseBase<int>._vptr_QPromiseBase =
       (_func_int **)CONCAT44(local_108.super_QPromiseBase<int>._vptr_QPromiseBase._4_4_,0xffffffff)
  ;
  iVar9 = waitForValue<int>(&p,(int *)&local_108);
  cVar8 = QTest::qCompare(iVar9,0x2a,"waitForValue(p, -1)","42",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                          ,0x2c);
  QVar4 = p.super_QPromiseBase<int>.m_d;
  if (cVar8 != '\0') {
    bVar7 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(p.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    bVar7 = (bool)(~bVar7 & ((QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.
                            m_data._M_exception_object == (void *)0x0);
    local_108.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)CONCAT71(local_108.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_,bVar7);
    local_90._vptr_QPromiseBase = (_func_int **)CONCAT71(local_90._vptr_QPromiseBase._1_7_,1);
    pcVar11 = QTest::toString<bool>((bool *)&local_108);
    pcVar12 = QTest::toString<bool>((bool *)&local_90);
    cVar8 = QTest::compare_helper
                      (bVar7,"Compared values are not the same",pcVar11,pcVar12,"p.isFulfilled()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                       ,0x2d);
    if (cVar8 != '\0') {
      QTest::qCompare(value,8,"value","8",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                      ,0x2e);
    }
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012ca28;
  if (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_qpromise_finally::fulfilledSync()
{
    int value = -1;
    auto p = QtPromise::QPromise<int>::resolve(42).finally([&]() {
        value = 8;
        return 16; // ignored!
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));
    QCOMPARE(waitForValue(p, -1), 42);
    QCOMPARE(p.isFulfilled(), true);
    QCOMPARE(value, 8);
}